

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-visitor.cc
# Opt level: O0

Result __thiscall wabt::ExprVisitor::VisitFunc(ExprVisitor *this,Func *func)

{
  Result RVar1;
  Func *func_local;
  ExprVisitor *this_local;
  
  RVar1 = VisitExprList(this,&func->exprs);
  return (Result)RVar1.enum_;
}

Assistant:

Result ExprVisitor::VisitFunc(Func* func) {
  return VisitExprList(func->exprs);
}